

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntConv.H
# Opt level: O0

void amrex::writeIntData<short,int>(int *data,size_t size,ostream *os,IntDescriptor *id)

{
  Ordering OVar1;
  Ordering OVar2;
  IntDescriptor *this;
  IntDescriptor *in_RCX;
  char *in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t j;
  bool swapEndian;
  short value;
  ulong local_30;
  int16_t local_22 [5];
  char *local_18;
  ulong local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  OVar1 = IntDescriptor::order(in_RCX);
  this = FPC::NativeIntDescriptor();
  OVar2 = IntDescriptor::order(this);
  for (local_30 = 0; local_30 < local_10; local_30 = local_30 + 1) {
    local_22[0] = (int16_t)*(undefined4 *)(local_8 + local_30 * 4);
    if (OVar1 != OVar2) {
      local_22[0] = swapBytes(local_22[0]);
    }
    std::ostream::write(local_18,(long)local_22);
  }
  return;
}

Assistant:

void writeIntData (const From* data, std::size_t size, std::ostream& os,
                       const amrex::IntDescriptor& id)
    {
        To value;
        bool swapEndian = (id.order() != amrex::FPC::NativeIntDescriptor().order());
        for (std::size_t j = 0; j < size; ++j) {
            value = static_cast<To>(data[j]);
            if (swapEndian) value = swapBytes(value);
            os.write((char*) &value, sizeof(To));
        }
    }